

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init
          (shaderCollectionForTextureFormat *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *in_RCX;
  long in_RDX;
  uint uVar4;
  ulong __new_size;
  TextureCubeMapArraySamplingTest *this_00;
  TextureCubeMapArraySamplingTest *in_R8;
  pointer this_01;
  string pass_through_tesselation_evaluation_shader_source;
  string pass_through_fragment_shader_source;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  this_00 = (TextureCubeMapArraySamplingTest *)this;
  getPassThroughFragmentShaderCode
            ((TextureCubeMapArraySamplingTest *)this,*(samplerType *)(in_RDX + 0x20),&local_50);
  getPassThroughTesselationEvaluationShaderCode(this_00,*(samplerType *)(in_RDX + 0x20),&local_70);
  shaderDefinition::init(&this->pass_through_fragment_shader,ctx);
  if ((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    shaderDefinition::init(&this->pass_through_tesselation_evaluation_shader,ctx);
  }
  compile(in_R8,&this->pass_through_fragment_shader);
  if ((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    compile(in_R8,&this->pass_through_tesselation_evaluation_shader);
  }
  piVar2 = (int *)*in_RCX;
  __new_size = 0;
  if ((int *)in_RCX[1] != piVar2) {
    do {
      uVar4 = (int)__new_size + (uint)(*piVar2 - 3U < 0xfffffffe || *(int *)(in_RDX + 0x20) != 3);
      __new_size = (ulong)uVar4;
      piVar2 = piVar2 + 4;
    } while (piVar2 != (int *)in_RCX[1]);
    __new_size = (ulong)uVar4;
  }
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
  ::resize(&this->per_sampling_routine,__new_size);
  piVar2 = (int *)*in_RCX;
  piVar1 = (int *)in_RCX[1];
  if (piVar1 != piVar2) {
    this_01 = (this->per_sampling_routine).
              super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((*(int *)(in_RDX + 0x20) != 3) || (*piVar2 - 3U < 0xfffffffe)) {
        shaderCollectionForSamplingRoutine::init(this_01,ctx);
        this_01 = this_01 + 1;
      }
      piVar2 = piVar2 + 4;
    } while (piVar2 != piVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  paVar3 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
    paVar3 = extraout_RAX;
  }
  return (int)paVar3;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init(
	const glw::Functions& gl, const formatDefinition& format, const samplingFunctionsVectorType& sampling_routines,
	TextureCubeMapArraySamplingTest& test)
{
	std::string pass_through_fragment_shader_source;
	std::string pass_through_tesselation_evaluation_shader_source;
	glw::GLuint n_routines_supporting_format = 0;

	test.getPassThroughFragmentShaderCode(format.m_sampler_type, pass_through_fragment_shader_source);
	test.getPassThroughTesselationEvaluationShaderCode(format.m_sampler_type,
													   pass_through_tesselation_evaluation_shader_source);

	pass_through_fragment_shader.init(gl, GL_FRAGMENT_SHADER, pass_through_fragment_shader_source, &test);

	if (test.m_is_tessellation_shader_supported)
	{
		pass_through_tesselation_evaluation_shader.init(gl, test.m_glExtTokens.TESS_EVALUATION_SHADER,
														pass_through_tesselation_evaluation_shader_source, &test);
	}

	test.compile(pass_through_fragment_shader);

	if (test.m_is_tessellation_shader_supported)
	{
		test.compile(pass_through_tesselation_evaluation_shader);
	}

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			n_routines_supporting_format += 1;
		}
	}

	per_sampling_routine.resize(n_routines_supporting_format);
	shaderCollectionForSamplingFunctionVectorType::iterator jt = per_sampling_routine.begin();

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			jt->init(gl, format, it->m_function, test);
			++jt;
		}
	}
}